

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 *puVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  undefined4 *puVar11;
  float *pfVar12;
  undefined4 *puVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  Collider CVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 (*pauVar47) [16];
  int iVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  long lVar50;
  undefined8 uVar51;
  uint uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  byte *pbVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  long lVar67;
  long lVar68;
  undefined1 (*pauVar69) [16];
  ulong uVar70;
  ulong uVar71;
  float fVar72;
  float fVar86;
  float fVar88;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  float fVar149;
  float fVar150;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  uint uVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  uint uVar166;
  float fVar167;
  uint uVar168;
  float fVar169;
  uint uVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined4 uVar181;
  float fVar182;
  float fVar183;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_12ac;
  undefined8 local_12a8;
  float fStack_12a0;
  float fStack_129c;
  undefined8 local_1298;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_1288;
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [16];
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  undefined1 (*local_1240) [16];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  byte *local_1210;
  uint *local_1208;
  Intersectors *local_1200;
  float *local_11f8;
  undefined4 local_11f0;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  undefined4 local_11c4;
  undefined4 local_11c0;
  float local_11bc;
  undefined4 local_11b8;
  undefined4 local_11b4;
  uint local_11b0;
  uint local_11ac;
  uint local_11a8;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined4 uStack_1178;
  undefined4 uStack_1174;
  long local_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [8];
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [16];
  undefined1 local_10f8 [16];
  float local_10e8 [4];
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8 [4];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [8];
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  long local_1048;
  ulong local_1040;
  ulong local_1038;
  ulong local_1030;
  long local_1028;
  ulong local_1020;
  ulong local_1018;
  ulong local_1010;
  ulong local_1008;
  long local_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  uint local_fa8;
  uint uStack_fa4;
  uint uStack_fa0;
  uint uStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    pauVar69 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar109 = *(float *)&This->ptr;
    fVar127 = *(float *)((long)&This->ptr + 4);
    fVar111 = *(float *)&This->leafIntersector;
    fVar118 = *(float *)((long)&This->leafIntersector + 4);
    CVar32 = This->collider;
    fVar122 = 0.0;
    if (0.0 <= fVar118) {
      fVar122 = fVar118;
    }
    fVar118 = *(float *)&(This->intersector1).intersect;
    fVar125 = 0.0;
    if (0.0 <= fVar118) {
      fVar125 = fVar118;
    }
    auVar73._4_4_ = -(uint)(ABS(CVar32.collide._4_4_) < DAT_01f4bd50._4_4_);
    auVar73._0_4_ = -(uint)(ABS(CVar32.collide._0_4_) < (float)DAT_01f4bd50);
    auVar73._8_4_ = -(uint)(ABS(CVar32.name._0_4_) < DAT_01f4bd50._8_4_);
    auVar73._12_4_ = -(uint)(ABS(CVar32.name._4_4_) < DAT_01f4bd50._12_4_);
    auVar134 = blendvps((undefined1  [16])CVar32,_DAT_01f4bd50,auVar73);
    auVar73 = rcpps(auVar73,auVar134);
    fVar156 = auVar73._0_4_;
    fVar157 = auVar73._4_4_;
    fVar158 = auVar73._8_4_;
    fVar156 = (1.0 - auVar134._0_4_ * fVar156) * fVar156 + fVar156;
    fVar157 = (1.0 - auVar134._4_4_ * fVar157) * fVar157 + fVar157;
    fVar158 = (1.0 - auVar134._8_4_ * fVar158) * fVar158 + fVar158;
    uVar66 = (ulong)(fVar156 < 0.0) * 0x10;
    uVar71 = (ulong)(fVar157 < 0.0) << 4 | 0x20;
    uVar70 = (ulong)(fVar158 < 0.0) << 4 | 0x40;
    auVar134._4_4_ = fVar125;
    auVar134._0_4_ = fVar125;
    auVar134._8_4_ = fVar125;
    auVar134._12_4_ = fVar125;
    _local_fa8 = mm_lookupmask_ps._240_8_;
    _uStack_fa0 = mm_lookupmask_ps._248_8_;
    local_1248 = ray;
    local_f88 = fVar111;
    fStack_f84 = fVar111;
    fStack_f80 = fVar111;
    fStack_f7c = fVar111;
    local_f98 = fVar122;
    fStack_f94 = fVar122;
    fStack_f90 = fVar122;
    fStack_f8c = fVar122;
    local_fb8 = fVar158;
    fStack_fb4 = fVar158;
    fStack_fb0 = fVar158;
    fStack_fac = fVar158;
    local_fc8 = fVar109;
    fStack_fc4 = fVar109;
    fStack_fc0 = fVar109;
    fStack_fbc = fVar109;
    local_fd8 = fVar127;
    fStack_fd4 = fVar127;
    fStack_fd0 = fVar127;
    fStack_fcc = fVar127;
    local_fe8 = fVar156;
    fStack_fe4 = fVar156;
    fStack_fe0 = fVar156;
    fStack_fdc = fVar156;
    local_ff8 = fVar157;
    fStack_ff4 = fVar157;
    fStack_ff0 = fVar157;
    fStack_fec = fVar157;
    fVar125 = fVar111;
    fVar110 = fVar111;
    fVar117 = fVar111;
    fVar121 = fVar122;
    fVar124 = fVar122;
    fVar72 = fVar122;
    fVar86 = fVar158;
    fVar87 = fVar158;
    fVar88 = fVar158;
    fVar89 = fVar109;
    fVar90 = fVar109;
    fVar91 = fVar109;
    fVar92 = fVar127;
    fVar93 = fVar127;
    fVar94 = fVar127;
    fVar104 = fVar156;
    fVar105 = fVar156;
    fVar106 = fVar156;
    fVar107 = fVar157;
    fVar108 = fVar157;
    fVar112 = fVar157;
LAB_00698b50:
    if (pauVar69 != (undefined1 (*) [16])&local_f78) {
      pauVar47 = pauVar69 + -1;
      pauVar69 = pauVar69 + -1;
      if (*(float *)((long)*pauVar47 + 8) <= fVar118) {
        uVar63 = *(ulong *)*pauVar69;
        while ((uVar63 & 8) == 0) {
          fVar113 = *(float *)((long)&(This->collider).name + 4);
          fVar118 = *(float *)&(This->intersector1).intersect;
          uVar49 = uVar63 & 0xfffffffffffffff0;
          pfVar31 = (float *)(uVar49 + 0x80 + uVar66);
          pfVar30 = (float *)(uVar49 + 0x20 + uVar66);
          auVar138._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar109) * fVar156;
          auVar138._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar89) * fVar104;
          auVar138._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar90) * fVar105;
          auVar138._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar91) * fVar106;
          auVar135._4_4_ = fVar121;
          auVar135._0_4_ = fVar122;
          auVar135._8_4_ = fVar124;
          auVar135._12_4_ = fVar72;
          auVar73 = maxps(auVar135,auVar138);
          pfVar31 = (float *)(uVar49 + 0x80 + uVar71);
          pfVar30 = (float *)(uVar49 + 0x20 + uVar71);
          auVar143._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar127) * fVar157;
          auVar143._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar92) * fVar107;
          auVar143._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar93) * fVar108;
          auVar143._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar94) * fVar112;
          pfVar31 = (float *)(uVar49 + 0x80 + uVar70);
          pfVar30 = (float *)(uVar49 + 0x20 + uVar70);
          auVar148._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar111) * fVar158;
          auVar148._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar125) * fVar86;
          auVar148._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar110) * fVar87;
          auVar148._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar117) * fVar88;
          auVar135 = maxps(auVar143,auVar148);
          _local_1148 = maxps(auVar73,auVar135);
          pfVar31 = (float *)(uVar49 + 0x80 + (uVar66 ^ 0x10));
          pfVar30 = (float *)(uVar49 + 0x20 + (uVar66 ^ 0x10));
          auVar140._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar109) * fVar156;
          auVar140._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar89) * fVar104;
          auVar140._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar90) * fVar105;
          auVar140._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar91) * fVar106;
          auVar73 = minps(auVar134,auVar140);
          pfVar31 = (float *)(uVar49 + 0x80 + (uVar71 ^ 0x10));
          pfVar30 = (float *)(uVar49 + 0x20 + (uVar71 ^ 0x10));
          auVar141._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar127) * fVar157;
          auVar141._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar92) * fVar107;
          auVar141._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar93) * fVar108;
          auVar141._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar94) * fVar112;
          pfVar31 = (float *)(uVar49 + 0x80 + (uVar70 ^ 0x10));
          pfVar30 = (float *)(uVar49 + 0x20 + (uVar70 ^ 0x10));
          auVar146._0_4_ = ((*pfVar31 * fVar113 + *pfVar30) - fVar111) * fVar158;
          auVar146._4_4_ = ((pfVar31[1] * fVar113 + pfVar30[1]) - fVar125) * fVar86;
          auVar146._8_4_ = ((pfVar31[2] * fVar113 + pfVar30[2]) - fVar110) * fVar87;
          auVar146._12_4_ = ((pfVar31[3] * fVar113 + pfVar30[3]) - fVar117) * fVar88;
          auVar135 = minps(auVar141,auVar146);
          auVar73 = minps(auVar73,auVar135);
          if (((uint)uVar63 & 7) == 6) {
            bVar40 = (fVar113 < *(float *)(uVar49 + 0xf0) && *(float *)(uVar49 + 0xe0) <= fVar113)
                     && local_1148._0_4_ <= auVar73._0_4_;
            bVar41 = (fVar113 < *(float *)(uVar49 + 0xf4) && *(float *)(uVar49 + 0xe4) <= fVar113)
                     && local_1148._4_4_ <= auVar73._4_4_;
            bVar42 = (fVar113 < *(float *)(uVar49 + 0xf8) && *(float *)(uVar49 + 0xe8) <= fVar113)
                     && local_1148._8_4_ <= auVar73._8_4_;
            bVar43 = (fVar113 < *(float *)(uVar49 + 0xfc) && *(float *)(uVar49 + 0xec) <= fVar113)
                     && local_1148._12_4_ <= auVar73._12_4_;
          }
          else {
            bVar40 = local_1148._0_4_ <= auVar73._0_4_;
            bVar41 = local_1148._4_4_ <= auVar73._4_4_;
            bVar42 = local_1148._8_4_ <= auVar73._8_4_;
            bVar43 = local_1148._12_4_ <= auVar73._12_4_;
          }
          auVar114._0_4_ = (uint)bVar40 * -0x80000000;
          auVar114._4_4_ = (uint)bVar41 * -0x80000000;
          auVar114._8_4_ = (uint)bVar42 * -0x80000000;
          auVar114._12_4_ = (uint)bVar43 * -0x80000000;
          uVar52 = movmskps((int)context,auVar114);
          context = (RayQueryContext *)(ulong)uVar52;
          if (uVar52 == 0) goto LAB_00698b50;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar52 != 0) {
            for (; ((byte)uVar52 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar63 = *(ulong *)(uVar49 + (long)context * 8);
          uVar52 = (uVar52 & 0xff) - 1 & uVar52 & 0xff;
          if (uVar52 != 0) {
            uVar159 = *(uint *)(local_1148 + (long)context * 4);
            lVar65 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
              }
            }
            uVar58 = *(ulong *)(uVar49 + lVar65 * 8);
            uVar160 = *(uint *)(local_1148 + lVar65 * 4);
            uVar52 = uVar52 - 1 & uVar52;
            context = (RayQueryContext *)(ulong)uVar52;
            if (uVar52 == 0) {
              if (uVar159 < uVar160) {
                *(ulong *)*pauVar69 = uVar58;
                *(uint *)((long)*pauVar69 + 8) = uVar160;
                pauVar69 = pauVar69 + 1;
              }
              else {
                *(ulong *)*pauVar69 = uVar63;
                *(uint *)((long)*pauVar69 + 8) = uVar159;
                uVar63 = uVar58;
                pauVar69 = pauVar69 + 1;
              }
            }
            else {
              auVar115._8_4_ = uVar159;
              auVar115._0_8_ = uVar63;
              auVar115._12_4_ = 0;
              auVar136._8_4_ = uVar160;
              auVar136._0_8_ = uVar58;
              auVar136._12_4_ = 0;
              lVar65 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar52 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              uVar51 = *(undefined8 *)(uVar49 + lVar65 * 8);
              iVar48 = *(int *)(local_1148 + lVar65 * 4);
              auVar128._8_4_ = iVar48;
              auVar128._0_8_ = uVar51;
              auVar128._12_4_ = 0;
              auVar74._8_4_ = -(uint)((int)uVar159 < (int)uVar160);
              uVar52 = uVar52 - 1 & uVar52;
              if (uVar52 == 0) {
                auVar74._4_4_ = auVar74._8_4_;
                auVar74._0_4_ = auVar74._8_4_;
                auVar74._12_4_ = auVar74._8_4_;
                auVar142._8_4_ = uVar160;
                auVar142._0_8_ = uVar58;
                auVar142._12_4_ = 0;
                auVar135 = blendvps(auVar142,auVar115,auVar74);
                auVar73 = blendvps(auVar115,auVar136,auVar74);
                auVar75._8_4_ = -(uint)(auVar135._8_4_ < iVar48);
                auVar75._4_4_ = auVar75._8_4_;
                auVar75._0_4_ = auVar75._8_4_;
                auVar75._12_4_ = auVar75._8_4_;
                auVar137._8_4_ = iVar48;
                auVar137._0_8_ = uVar51;
                auVar137._12_4_ = 0;
                auVar138 = blendvps(auVar137,auVar135,auVar75);
                auVar143 = blendvps(auVar135,auVar128,auVar75);
                auVar76._8_4_ = -(uint)(auVar73._8_4_ < auVar143._8_4_);
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar135 = blendvps(auVar143,auVar73,auVar76);
                auVar73 = blendvps(auVar73,auVar143,auVar76);
                *pauVar69 = auVar73;
                pauVar69[1] = auVar135;
                uVar63 = auVar138._0_8_;
                pauVar69 = pauVar69 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar77._4_4_ = auVar74._8_4_;
                auVar77._0_4_ = auVar74._8_4_;
                auVar77._8_4_ = auVar74._8_4_;
                auVar77._12_4_ = auVar74._8_4_;
                auVar143 = blendvps(auVar136,auVar115,auVar77);
                auVar73 = blendvps(auVar115,auVar136,auVar77);
                auVar147._8_4_ = *(int *)(local_1148 + (long)context * 4);
                auVar147._0_8_ = *(undefined8 *)(uVar49 + (long)context * 8);
                auVar147._12_4_ = 0;
                auVar78._8_4_ = -(uint)(iVar48 < *(int *)(local_1148 + (long)context * 4));
                auVar78._4_4_ = auVar78._8_4_;
                auVar78._0_4_ = auVar78._8_4_;
                auVar78._12_4_ = auVar78._8_4_;
                auVar138 = blendvps(auVar147,auVar128,auVar78);
                auVar135 = blendvps(auVar128,auVar147,auVar78);
                auVar79._8_4_ = -(uint)(auVar73._8_4_ < auVar135._8_4_);
                auVar79._4_4_ = auVar79._8_4_;
                auVar79._0_4_ = auVar79._8_4_;
                auVar79._12_4_ = auVar79._8_4_;
                auVar148 = blendvps(auVar135,auVar73,auVar79);
                auVar73 = blendvps(auVar73,auVar135,auVar79);
                auVar80._8_4_ = -(uint)(auVar143._8_4_ < auVar138._8_4_);
                auVar80._4_4_ = auVar80._8_4_;
                auVar80._0_4_ = auVar80._8_4_;
                auVar80._12_4_ = auVar80._8_4_;
                auVar135 = blendvps(auVar138,auVar143,auVar80);
                auVar143 = blendvps(auVar143,auVar138,auVar80);
                auVar81._8_4_ = -(uint)(auVar143._8_4_ < auVar148._8_4_);
                auVar81._4_4_ = auVar81._8_4_;
                auVar81._0_4_ = auVar81._8_4_;
                auVar81._12_4_ = auVar81._8_4_;
                auVar138 = blendvps(auVar148,auVar143,auVar81);
                auVar143 = blendvps(auVar143,auVar148,auVar81);
                *pauVar69 = auVar73;
                pauVar69[1] = auVar143;
                pauVar69[2] = auVar138;
                uVar63 = auVar135._0_8_;
                pauVar69 = pauVar69 + 3;
              }
            }
          }
        }
        local_1048 = (ulong)((uint)uVar63 & 0xf) - 8;
        uVar63 = uVar63 & 0xfffffffffffffff0;
        local_1240 = pauVar69;
        for (local_1000 = 0; local_1000 != local_1048; local_1000 = local_1000 + 1) {
          lVar67 = local_1000 * 0x60;
          local_1170 = *(long *)&(ray->super_RayK<1>).org.field_0;
          lVar65 = *(long *)(local_1170 + 0x1e8);
          lVar37 = *(long *)(lVar65 + (ulong)*(uint *)(uVar63 + 0x40 + lVar67) * 8);
          fVar109 = *(float *)(lVar37 + 0x30) - *(float *)(lVar37 + 0x2c);
          fVar127 = ((*(float *)((long)&(This->collider).name + 4) - *(float *)(lVar37 + 0x2c)) /
                    fVar109) * *(float *)(lVar37 + 0x28);
          auVar116 = roundss(ZEXT416((uint)fVar109),ZEXT416((uint)fVar127),9);
          fVar109 = *(float *)(lVar37 + 0x28) + -1.0;
          if (fVar109 <= auVar116._0_4_) {
            auVar116._0_4_ = fVar109;
          }
          fVar109 = 0.0;
          if (0.0 <= auVar116._0_4_) {
            fVar109 = auVar116._0_4_;
          }
          lVar68 = (long)(int)fVar109 * 0x38;
          lVar38 = *(long *)(*(long *)(lVar37 + 0xe0) + lVar68);
          local_1018 = (ulong)*(uint *)(uVar63 + 4 + lVar67);
          pfVar30 = (float *)(lVar38 + (ulong)*(uint *)(uVar63 + lVar67) * 4);
          uVar49 = (ulong)*(uint *)(uVar63 + 0x10 + lVar67);
          lVar1 = lVar38 + uVar49 * 4;
          uVar58 = (ulong)*(uint *)(uVar63 + 0x20 + lVar67);
          pfVar31 = (float *)(lVar38 + uVar58 * 4);
          uVar59 = (ulong)*(uint *)(uVar63 + 0x30 + lVar67);
          pfVar2 = (float *)(lVar38 + uVar59 * 4);
          local_1028 = *(long *)(*(long *)(lVar65 + (ulong)*(uint *)(uVar63 + 0x44 + lVar67) * 8) +
                                0xe0);
          lVar39 = *(long *)(local_1028 + lVar68);
          pfVar3 = (float *)(lVar39 + local_1018 * 4);
          local_1008 = (ulong)*(uint *)(uVar63 + 0x14 + lVar67);
          lVar38 = lVar39 + local_1008 * 4;
          uVar60 = (ulong)*(uint *)(uVar63 + 0x24 + lVar67);
          pfVar4 = (float *)(lVar39 + uVar60 * 4);
          uVar61 = (ulong)*(uint *)(uVar63 + 0x34 + lVar67);
          pfVar5 = (float *)(lVar39 + uVar61 * 4);
          lVar39 = *(long *)(*(long *)(lVar65 + (ulong)*(uint *)(uVar63 + 0x48 + lVar67) * 8) + 0xe0
                            );
          lVar50 = *(long *)(lVar39 + lVar68);
          uVar62 = (ulong)*(uint *)(uVar63 + 8 + lVar67);
          pfVar6 = (float *)(lVar50 + uVar62 * 4);
          local_1020 = (ulong)*(uint *)(uVar63 + 0x18 + lVar67);
          puVar7 = (undefined4 *)(lVar50 + local_1020 * 4);
          local_1010 = (ulong)*(uint *)(uVar63 + 0x28 + lVar67);
          pfVar8 = (float *)(lVar50 + local_1010 * 4);
          puVar9 = (undefined4 *)(lVar50 + (ulong)*(uint *)(uVar63 + 0x38 + lVar67) * 4);
          fVar127 = fVar127 - fVar109;
          lVar65 = *(long *)(*(long *)(lVar65 + (ulong)*(uint *)(uVar63 + 0x4c + lVar67) * 8) + 0xe0
                            );
          lVar50 = *(long *)(lVar65 + lVar68);
          uVar64 = (ulong)*(uint *)(uVar63 + 0xc + lVar67);
          pfVar10 = (float *)(lVar50 + uVar64 * 4);
          local_1040 = (ulong)*(uint *)(uVar63 + 0x1c + lVar67);
          puVar11 = (undefined4 *)(lVar50 + local_1040 * 4);
          local_1038 = (ulong)*(uint *)(uVar63 + 0x2c + lVar67);
          pfVar12 = (float *)(lVar50 + local_1038 * 4);
          uVar52 = *(uint *)(uVar63 + 0x3c + lVar67);
          local_1030 = (ulong)uVar52;
          puVar13 = (undefined4 *)(lVar50 + local_1030 * 4);
          local_1248 = (RayHit *)CONCAT44(*puVar11,*puVar7);
          lVar50 = (long)((int)fVar109 + 1) * 0x38;
          context = *(RayQueryContext **)(*(long *)(lVar37 + 0xe0) + lVar50);
          pfVar14 = (float *)((long)&context->scene + (ulong)*(uint *)(uVar63 + lVar67) * 4);
          local_1218 = (int *)CONCAT44(pfVar12[2],pfVar8[2]);
          lVar37 = *(long *)(lVar39 + lVar50);
          pfVar15 = (float *)(lVar37 + uVar62 * 4);
          uStack_1178 = *puVar9;
          uStack_1174 = *puVar13;
          lVar39 = *(long *)(local_1028 + lVar50);
          pfVar16 = (float *)(lVar39 + local_1018 * 4);
          lVar65 = *(long *)(lVar65 + lVar50);
          pfVar17 = (float *)(lVar65 + uVar64 * 4);
          pfVar18 = (float *)((long)&context->scene + uVar49 * 4);
          pfVar19 = (float *)(lVar37 + local_1020 * 4);
          pfVar20 = (float *)(lVar39 + local_1008 * 4);
          pfVar21 = (float *)(lVar65 + local_1040 * 4);
          pfVar22 = (float *)((long)&context->scene + uVar58 * 4);
          pfVar23 = (float *)(lVar37 + local_1010 * 4);
          pfVar24 = (float *)(lVar39 + uVar60 * 4);
          pfVar25 = (float *)(lVar65 + local_1038 * 4);
          pfVar26 = (float *)((long)&context->scene + uVar59 * 4);
          pfVar27 = (float *)(lVar37 + CONCAT44(puVar13[2],puVar9[2]) * 4);
          pfVar28 = (float *)(lVar39 + uVar61 * 4);
          pfVar29 = (float *)(lVar65 + local_1030 * 4);
          fVar109 = 1.0 - fVar127;
          fVar92 = *pfVar30 * fVar109 + *pfVar14 * fVar127;
          fVar156 = *pfVar3 * fVar109 + *pfVar16 * fVar127;
          fVar106 = *pfVar6 * fVar109 + *pfVar15 * fVar127;
          fVar107 = *pfVar10 * fVar109 + *pfVar17 * fVar127;
          fVar93 = pfVar30[1] * fVar109 + pfVar14[1] * fVar127;
          fVar104 = pfVar3[1] * fVar109 + pfVar16[1] * fVar127;
          fStack_1190 = pfVar6[1] * fVar109 + pfVar15[1] * fVar127;
          fStack_118c = pfVar10[1] * fVar109 + pfVar17[1] * fVar127;
          local_11d8 = pfVar30[2] * fVar109 + pfVar14[2] * fVar127;
          fStack_11d4 = pfVar3[2] * fVar109 + pfVar16[2] * fVar127;
          fStack_11d0 = pfVar6[2] * fVar109 + pfVar15[2] * fVar127;
          fStack_11cc = pfVar10[2] * fVar109 + pfVar17[2] * fVar127;
          local_1258._0_4_ = *pfVar8 * fVar109 + *pfVar18 * fVar127;
          local_1258._4_4_ = *pfVar12 * fVar109 + *pfVar20 * fVar127;
          fStack_1250 = fStack_1250 * fVar109 + *pfVar19 * fVar127;
          fStack_124c = fStack_124c * fVar109 + *pfVar21 * fVar127;
          local_1068 = *(float *)(lVar1 + 4) * fVar109 + pfVar18[1] * fVar127;
          fStack_1064 = *(float *)(lVar38 + 4) * fVar109 + pfVar20[1] * fVar127;
          fStack_1060 = (float)puVar7[1] * fVar109 + pfVar19[1] * fVar127;
          fStack_105c = (float)puVar11[1] * fVar109 + pfVar21[1] * fVar127;
          local_1058 = *(float *)(lVar1 + 8) * fVar109 + pfVar18[2] * fVar127;
          fStack_1054 = *(float *)(lVar38 + 8) * fVar109 + pfVar20[2] * fVar127;
          fStack_1050 = (float)puVar7[2] * fVar109 + pfVar19[2] * fVar127;
          fStack_104c = (float)puVar11[2] * fVar109 + pfVar21[2] * fVar127;
          fVar110 = *pfVar31 * fVar109 + *pfVar22 * fVar127;
          fVar117 = *pfVar4 * fVar109 + *pfVar24 * fVar127;
          fVar121 = fStack_1260 * fVar109 + *pfVar23 * fVar127;
          fVar124 = fStack_125c * fVar109 + *pfVar25 * fVar127;
          local_1268._4_4_ = fVar117;
          local_1268._0_4_ = fVar110;
          fStack_1260 = fVar121;
          fStack_125c = fVar124;
          fVar111 = pfVar31[1] * fVar109 + pfVar22[1] * fVar127;
          fVar118 = pfVar4[1] * fVar109 + pfVar24[1] * fVar127;
          fVar122 = pfVar8[1] * fVar109 + pfVar23[1] * fVar127;
          fVar125 = pfVar12[1] * fVar109 + pfVar25[1] * fVar127;
          local_1288 = (byte *)CONCAT44(fVar118,fVar111);
          fStack_1280 = fVar122;
          fStack_127c = fVar125;
          local_1228._0_4_ = pfVar31[2] * fVar109 + pfVar22[2] * fVar127;
          local_1228._4_4_ = pfVar4[2] * fVar109 + pfVar24[2] * fVar127;
          fStack_1220 = fStack_1220 * fVar109 + pfVar23[2] * fVar127;
          fStack_121c = fStack_121c * fVar109 + pfVar25[2] * fVar127;
          local_1188 = *pfVar2 * fVar109 + *pfVar26 * fVar127;
          fStack_1184 = *pfVar5 * fVar109 + *pfVar28 * fVar127;
          fStack_1180 = fStack_1180 * fVar109 + *pfVar27 * fVar127;
          fStack_117c = fStack_117c * fVar109 + *pfVar29 * fVar127;
          local_1078 = pfVar2[1] * fVar109 + pfVar26[1] * fVar127;
          fStack_1074 = pfVar5[1] * fVar109 + pfVar28[1] * fVar127;
          fStack_1070 = (float)puVar9[1] * fVar109 + pfVar27[1] * fVar127;
          fStack_106c = (float)puVar13[1] * fVar109 + pfVar29[1] * fVar127;
          local_1088 = fVar109 * pfVar2[2] + fVar127 * pfVar26[2];
          fStack_1084 = fVar109 * pfVar5[2] + fVar127 * pfVar28[2];
          fStack_1080 = fVar109 * fStack_1160 + fVar127 * pfVar27[2];
          fStack_107c = fVar109 * fStack_115c + fVar127 * pfVar29[2];
          fVar145 = fVar93 - local_1068;
          fVar149 = fVar104 - fStack_1064;
          fVar150 = fStack_1190 - fStack_1060;
          fVar151 = fStack_118c - fStack_105c;
          fVar179 = local_11d8 - local_1058;
          fVar180 = fStack_11d4 - fStack_1054;
          fVar182 = fStack_11d0 - fStack_1050;
          fVar183 = fStack_11cc - fStack_104c;
          fVar163 = local_1078 - fVar93;
          fVar165 = fStack_1074 - fVar104;
          fVar167 = fStack_1070 - fStack_1190;
          fVar169 = fStack_106c - fStack_118c;
          fVar171 = local_1088 - local_11d8;
          fVar172 = fStack_1084 - fStack_11d4;
          fVar173 = fStack_1080 - fStack_11d0;
          fVar174 = fStack_107c - fStack_11cc;
          local_10b8[0] = fVar179 * fVar163 - fVar145 * fVar171;
          local_10b8[1] = fVar180 * fVar165 - fVar149 * fVar172;
          local_10b8[2] = fVar182 * fVar167 - fVar150 * fVar173;
          local_10b8[3] = fVar183 * fVar169 - fVar151 * fVar174;
          fVar152 = local_1188 - fVar92;
          fVar153 = fStack_1184 - fVar156;
          fVar154 = fStack_1180 - fVar106;
          fVar155 = fStack_117c - fVar107;
          local_1158 = *(float *)&This->ptr;
          fStack_12a0 = *(float *)((long)&This->ptr + 4);
          fVar109 = *(float *)&This->leafIntersector;
          fVar127 = *(float *)&(This->collider).collide;
          local_11e8._0_4_ = *(float *)((long)&(This->collider).collide + 4);
          local_1238 = *(float *)&(This->collider).name;
          fStack_1154 = local_1158;
          fStack_1150 = local_1158;
          fStack_114c = local_1158;
          fVar112 = fVar92 - local_1158;
          fVar119 = fVar156 - local_1158;
          fStack_1290 = fVar106 - local_1158;
          fStack_128c = fVar107 - local_1158;
          local_12a8 = CONCAT44(fStack_12a0,fStack_12a0);
          fStack_129c = fStack_12a0;
          fVar93 = fVar93 - fStack_12a0;
          fVar104 = fVar104 - fStack_12a0;
          fStack_1190 = fStack_1190 - fStack_12a0;
          fStack_118c = fStack_118c - fStack_12a0;
          fVar113 = fVar112 * (float)local_11e8 - fVar93 * fVar127;
          fVar120 = fVar119 * (float)local_11e8 - fVar104 * fVar127;
          fVar123 = fStack_1290 * (float)local_11e8 - fStack_1190 * fVar127;
          fVar126 = fStack_128c * (float)local_11e8 - fStack_118c * fVar127;
          fVar92 = fVar92 - (float)local_1258;
          fVar156 = fVar156 - local_1258._4_4_;
          fVar106 = fVar106 - fStack_1250;
          fVar107 = fVar107 - fStack_124c;
          fVar72 = fVar92 * fVar171 - fVar179 * fVar152;
          fVar86 = fVar156 * fVar172 - fVar180 * fVar153;
          fVar88 = fVar106 * fVar173 - fVar182 * fVar154;
          fVar90 = fVar107 * fVar174 - fVar183 * fVar155;
          _local_1168 = CONCAT44(fVar109,fVar109);
          fStack_1160 = fVar109;
          fStack_115c = fVar109;
          local_11d8 = local_11d8 - fVar109;
          fStack_11d4 = fStack_11d4 - fVar109;
          fStack_11d0 = fStack_11d0 - fVar109;
          fStack_11cc = fStack_11cc - fVar109;
          fVar94 = local_11d8 * fVar127 - fVar112 * local_1238;
          fVar105 = fStack_11d4 * fVar127 - fVar119 * local_1238;
          fVar157 = fStack_11d0 * fVar127 - fStack_1290 * local_1238;
          fVar108 = fStack_11cc * fVar127 - fStack_128c * local_1238;
          local_1098._0_4_ = fVar145 * fVar152 - fVar92 * fVar163;
          local_1098._4_4_ = fVar149 * fVar153 - fVar156 * fVar165;
          fStack_1090 = fVar150 * fVar154 - fVar106 * fVar167;
          fStack_108c = fVar151 * fVar155 - fVar107 * fVar169;
          local_1198 = CONCAT44(fVar104,fVar93);
          fVar175 = fVar93 * local_1238 - local_11d8 * (float)local_11e8;
          fVar176 = fVar104 * local_1238 - fStack_11d4 * (float)local_11e8;
          fVar177 = fStack_1190 * local_1238 - fStack_11d0 * (float)local_11e8;
          fVar178 = fStack_118c * local_1238 - fStack_11cc * (float)local_11e8;
          fStack_1234 = local_1238;
          fStack_1230 = local_1238;
          fStack_122c = local_1238;
          local_11e8._4_4_ = (float)local_11e8;
          fStack_11e0 = (float)local_11e8;
          fStack_11dc = (float)local_11e8;
          fVar158 = fVar127 * local_10b8[0] +
                    (float)local_11e8 * fVar72 + local_1238 * (float)local_1098._0_4_;
          fVar87 = fVar127 * local_10b8[1] +
                   (float)local_11e8 * fVar86 + local_1238 * (float)local_1098._4_4_;
          fVar89 = fVar127 * local_10b8[2] + (float)local_11e8 * fVar88 + local_1238 * fStack_1090;
          fVar91 = fVar127 * local_10b8[3] + (float)local_11e8 * fVar90 + local_1238 * fStack_108c;
          uVar164 = (uint)fVar158 & 0x80000000;
          uVar166 = (uint)fVar87 & 0x80000000;
          uVar168 = (uint)fVar89 & 0x80000000;
          uVar170 = (uint)fVar91 & 0x80000000;
          local_1148._0_4_ =
               (uint)(fVar152 * fVar175 + fVar163 * fVar94 + fVar171 * fVar113) ^ uVar164;
          local_1148._4_4_ =
               (uint)(fVar153 * fVar176 + fVar165 * fVar105 + fVar172 * fVar120) ^ uVar166;
          fStack_1140 = (float)((uint)(fVar154 * fVar177 + fVar167 * fVar157 + fVar173 * fVar123) ^
                               uVar168);
          fStack_113c = (float)((uint)(fVar155 * fVar178 + fVar169 * fVar108 + fVar174 * fVar126) ^
                               uVar170);
          local_1138._0_4_ =
               (uint)(fVar175 * fVar92 + fVar94 * fVar145 + fVar113 * fVar179) ^ uVar164;
          local_1138._4_4_ =
               (uint)(fVar176 * fVar156 + fVar105 * fVar149 + fVar120 * fVar180) ^ uVar166;
          fStack_1130 = (float)((uint)(fVar177 * fVar106 + fVar157 * fVar150 + fVar123 * fVar182) ^
                               uVar168);
          fStack_112c = (float)((uint)(fVar178 * fVar107 + fVar108 * fVar151 + fVar126 * fVar183) ^
                               uVar170);
          fVar92 = ABS(fVar158);
          fVar94 = ABS(fVar87);
          local_1118._0_8_ = CONCAT44(fVar87,fVar158) & 0x7fffffff7fffffff;
          local_1118._8_4_ = ABS(fVar89);
          local_1118._12_4_ = ABS(fVar91);
          uVar159 = -(uint)((0.0 <= (float)local_1138._0_4_ && 0.0 <= (float)local_1148._0_4_) &&
                           fVar158 != 0.0) & local_fa8 &
                    -(uint)((float)local_1148._0_4_ + (float)local_1138._0_4_ <= fVar92);
          uVar160 = -(uint)((0.0 <= (float)local_1138._4_4_ && 0.0 <= (float)local_1148._4_4_) &&
                           fVar87 != 0.0) & uStack_fa4 &
                    -(uint)((float)local_1148._4_4_ + (float)local_1138._4_4_ <= fVar94);
          uVar161 = -(uint)((0.0 <= fStack_1130 && 0.0 <= fStack_1140) && fVar89 != 0.0) &
                    uStack_fa0 & -(uint)(fStack_1140 + fStack_1130 <= local_1118._8_4_);
          uVar162 = -(uint)((0.0 <= fStack_112c && 0.0 <= fStack_113c) && fVar91 != 0.0) &
                    uStack_f9c & -(uint)(fStack_113c + fStack_112c <= local_1118._12_4_);
          local_12a8 = uVar63 + lVar67;
          auVar44._4_4_ = uVar160;
          auVar44._0_4_ = uVar159;
          auVar44._8_4_ = uVar161;
          auVar44._12_4_ = uVar162;
          iVar48 = movmskps(uVar52,auVar44);
          ray = local_1248;
          lVar65 = local_12a8;
          pauVar69 = local_1240;
          if (iVar48 == 0) {
            auVar103._4_4_ = local_1158;
            auVar103._0_4_ = local_1158;
            auVar103._8_4_ = local_1158;
            auVar103._12_4_ = local_1158;
            uVar52 = 0;
          }
          else {
            local_1128 = (float)(uVar164 ^
                                (uint)(fVar112 * local_10b8[0] +
                                      fVar93 * fVar72 + local_11d8 * (float)local_1098._0_4_));
            fStack_1124 = (float)(uVar166 ^
                                 (uint)(fVar119 * local_10b8[1] +
                                       fVar104 * fVar86 + fStack_11d4 * (float)local_1098._4_4_));
            fStack_1120 = (float)(uVar168 ^
                                 (uint)(fStack_1290 * local_10b8[2] +
                                       fStack_1190 * fVar88 + fStack_11d0 * fStack_1090));
            fStack_111c = (float)(uVar170 ^
                                 (uint)(fStack_128c * local_10b8[3] +
                                       fStack_118c * fVar90 + fStack_11cc * fStack_108c));
            fVar158 = *(float *)((long)&This->leafIntersector + 4);
            auVar33._0_8_ = (This->intersector1).intersect;
            auVar33._8_8_ = (This->intersector1).occluded;
            fVar87 = (float)auVar33._0_8_;
            uVar181 = (undefined4)((ulong)auVar33._0_8_ >> 0x20);
            uVar55 = (undefined4)auVar33._8_8_;
            uVar56 = (undefined4)((ulong)auVar33._8_8_ >> 0x20);
            auVar82._0_4_ =
                 -(uint)(fVar158 * fVar92 < local_1128 && local_1128 <= fVar87 * fVar92) & uVar159;
            auVar82._4_4_ =
                 -(uint)(fVar158 * fVar94 < fStack_1124 && fStack_1124 <= fVar87 * fVar94) & uVar160
            ;
            auVar82._8_4_ =
                 -(uint)(fVar158 * local_1118._8_4_ < fStack_1120 &&
                        fStack_1120 <= fVar87 * local_1118._8_4_) & uVar161;
            auVar82._12_4_ =
                 -(uint)(fVar158 * local_1118._12_4_ < fStack_111c &&
                        fStack_111c <= fVar87 * local_1118._12_4_) & uVar162;
            uVar52 = movmskps(iVar48,auVar82);
            auVar103._4_4_ = local_1158;
            auVar103._0_4_ = local_1158;
            auVar103._8_4_ = local_1158;
            auVar103._12_4_ = local_1158;
            if (uVar52 != 0) {
              local_10f8 = auVar82;
              local_10a8 = CONCAT44(fVar86,fVar72);
              uStack_10a0 = CONCAT44(fVar90,fVar88);
              local_1278 = auVar82;
              auVar73 = rcpps(auVar103,local_1118);
              fVar86 = auVar73._0_4_;
              fVar88 = auVar73._4_4_;
              fVar89 = auVar73._8_4_;
              fVar90 = auVar73._12_4_;
              fVar86 = (1.0 - fVar92 * fVar86) * fVar86 + fVar86;
              fVar88 = (1.0 - fVar94 * fVar88) * fVar88 + fVar88;
              fVar89 = (1.0 - local_1118._8_4_ * fVar89) * fVar89 + fVar89;
              fVar90 = (1.0 - local_1118._12_4_ * fVar90) * fVar90 + fVar90;
              fVar109 = local_1128 * fVar86;
              fVar127 = fStack_1124 * fVar88;
              fVar72 = fStack_1120 * fVar89;
              fVar158 = fStack_111c * fVar90;
              local_10c8._4_4_ = fVar127;
              local_10c8._0_4_ = fVar109;
              fStack_10c0 = fVar72;
              fStack_10bc = fVar158;
              local_10e8[0] = (float)local_1148._0_4_ * fVar86;
              local_10e8[1] = (float)local_1148._4_4_ * fVar88;
              local_10e8[2] = fStack_1140 * fVar89;
              local_10e8[3] = fStack_113c * fVar90;
              local_10d8._4_4_ = fVar88 * (float)local_1138._4_4_;
              local_10d8._0_4_ = fVar86 * (float)local_1138._0_4_;
              fStack_10d0 = fVar89 * fStack_1130;
              fStack_10cc = fVar90 * fStack_112c;
              auVar45._4_4_ = fVar127;
              auVar45._0_4_ = fVar109;
              auVar45._8_4_ = fVar72;
              auVar45._12_4_ = fVar158;
              auVar134 = blendvps(_DAT_01f45a30,auVar45,auVar82);
              auVar129._4_4_ = auVar134._0_4_;
              auVar129._0_4_ = auVar134._4_4_;
              auVar129._8_4_ = auVar134._12_4_;
              auVar129._12_4_ = auVar134._8_4_;
              auVar73 = minps(auVar129,auVar134);
              auVar95._0_8_ = auVar73._8_8_;
              auVar95._8_4_ = auVar73._0_4_;
              auVar95._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar95,auVar73);
              auVar96._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar134._4_4_) & auVar82._4_4_,
                            -(uint)(auVar73._0_4_ == auVar134._0_4_) & auVar82._0_4_);
              auVar96._8_4_ = -(uint)(auVar73._8_4_ == auVar134._8_4_) & auVar82._8_4_;
              auVar96._12_4_ = -(uint)(auVar73._12_4_ == auVar134._12_4_) & auVar82._12_4_;
              iVar48 = movmskps(uVar52,auVar96);
              if (iVar48 != 0) {
                auVar82._8_4_ = auVar96._8_4_;
                auVar82._0_8_ = auVar96._0_8_;
                auVar82._12_4_ = auVar96._12_4_;
              }
              uVar51 = extractps(auVar33,1);
              uVar53 = movmskps((int)context,auVar82);
              uVar49 = CONCAT44((int)((ulong)context >> 0x20),uVar53);
              lVar65 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
LAB_0069995a:
              local_11b0 = *(uint *)(local_12a8 + 0x40 + lVar65 * 4);
              pbVar57 = (byte *)(ulong)local_11b0;
              local_11e8 = *(byte **)(*(long *)(local_1170 + 0x1e8) + (long)pbVar57 * 8);
              if ((*(uint *)(local_11e8 + 0x34) & (uint)uVar51) == 0) {
                *(undefined4 *)(local_1278 + lVar65 * 4) = 0;
                goto LAB_006999bd;
              }
              local_1298 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
              if (*(long *)(local_1298 + 0x10) == 0) {
                local_1208 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                if (*(long *)(local_11e8 + 0x40) == 0) {
                  fVar109 = local_10e8[lVar65];
                  uVar181 = *(undefined4 *)(local_10d8 + lVar65 * 4);
                  *(float *)&(This->intersector1).intersect = local_10b8[lVar65 + -4];
                  *(float *)&(This->intersector1).pointQuery = local_10b8[lVar65];
                  *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                       *(undefined4 *)((long)&local_10a8 + lVar65 * 4);
                  *(undefined4 *)&(This->intersector1).name =
                       *(undefined4 *)(local_1098 + lVar65 * 4);
                  *(float *)((long)&(This->intersector1).name + 4) = fVar109;
                  *(undefined4 *)&(This->intersector4).intersect = uVar181;
                  *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                       *(undefined4 *)(local_12a8 + 0x50 + lVar65 * 4);
                  *(uint *)&(This->intersector4).occluded = local_11b0;
                  context = (RayQueryContext *)(ulong)*local_1208;
                  *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1208;
                  uVar52 = local_1208[1];
                  *(uint *)&(This->intersector4).name = uVar52;
LAB_0069a0f8:
                  uVar181 = *(undefined4 *)&This->ptr;
                  fStack_12a0 = *(float *)((long)&This->ptr + 4);
                  fVar109 = *(float *)&This->leafIntersector;
                  fVar127 = *(float *)&(This->collider).collide;
                  local_11e8._0_4_ = *(float *)((long)&(This->collider).collide + 4);
                  local_1238 = *(float *)&(This->collider).name;
                  auVar103._4_4_ = uVar181;
                  auVar103._0_4_ = uVar181;
                  auVar103._8_4_ = uVar181;
                  auVar103._12_4_ = uVar181;
                  local_11e8._4_4_ = (float)local_11e8;
                  fStack_11e0 = (float)local_11e8;
                  fStack_11dc = (float)local_11e8;
                  fStack_1234 = local_1238;
                  fStack_1230 = local_1238;
                  fStack_122c = local_1238;
                  lVar65 = local_12a8;
                  goto LAB_00699602;
                }
                fStack_1230 = (float)uVar55;
                fStack_122c = (float)uVar56;
                local_11d8 = fVar109;
                fStack_11d4 = fVar127;
                fStack_11d0 = fVar72;
                fStack_11cc = fVar158;
              }
              else {
                fStack_1230 = (float)uVar55;
                fStack_122c = (float)uVar56;
                local_11d8 = fVar109;
                fStack_11d4 = fVar127;
                fStack_11d0 = fVar72;
                fStack_11cc = fVar158;
                local_1208 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              }
              _local_1238 = CONCAT44(uVar181,fVar87);
              local_11c8 = local_10b8[lVar65];
              local_11c4 = *(undefined4 *)((long)&local_10a8 + lVar65 * 4);
              local_11c0 = *(undefined4 *)(local_1098 + lVar65 * 4);
              local_11bc = local_10e8[lVar65];
              local_11b8 = *(undefined4 *)(local_10d8 + lVar65 * 4);
              local_11b4 = *(undefined4 *)(local_12a8 + 0x50 + lVar65 * 4);
              local_11ac = *local_1208;
              local_11a8 = local_1208[1];
              local_1198 = lVar65;
              *(float *)&(This->intersector1).intersect = local_10b8[lVar65 + -4];
              local_12ac = -1;
              local_1218 = &local_12ac;
              pbVar57 = *(byte **)(local_11e8 + 0x18);
              local_1210 = pbVar57;
              local_1200 = This;
              local_11f8 = &local_11c8;
              local_11f0 = 1;
              fStack_1230 = (float)uVar55;
              fStack_122c = (float)uVar56;
              local_11d8 = fVar109;
              fStack_11d4 = fVar127;
              fStack_11d0 = fVar72;
              fStack_11cc = fVar158;
              if (((*(code **)(local_11e8 + 0x40) == (code *)0x0) ||
                  ((**(code **)(local_11e8 + 0x40))(&local_1218), *local_1218 != 0)) &&
                 ((*(code **)(local_1298 + 0x10) == (code *)0x0 ||
                  (((pbVar57 = local_1298, (*local_1298 & 2) == 0 &&
                    (pbVar57 = local_11e8, (local_11e8[0x3e] & 0x40) == 0)) ||
                   ((**(code **)(local_1298 + 0x10))(&local_1218), *local_1218 != 0)))))) {
                *(float *)&(local_1200->intersector1).pointQuery = *local_11f8;
                *(float *)((long)&(local_1200->intersector1).pointQuery + 4) = local_11f8[1];
                *(float *)&(local_1200->intersector1).name = local_11f8[2];
                *(float *)((long)&(local_1200->intersector1).name + 4) = local_11f8[3];
                *(float *)&(local_1200->intersector4).intersect = local_11f8[4];
                *(float *)((long)&(local_1200->intersector4).intersect + 4) = local_11f8[5];
                *(float *)&(local_1200->intersector4).occluded = local_11f8[6];
                *(float *)((long)&(local_1200->intersector4).occluded + 4) = local_11f8[7];
                pbVar57 = (byte *)(ulong)(uint)local_11f8[8];
                *(float *)&(local_1200->intersector4).name = local_11f8[8];
              }
              else {
                *(float *)&(This->intersector1).intersect = local_1238;
              }
              *(undefined4 *)(local_1278 + local_1198 * 4) = 0;
              auVar34._0_8_ = (This->intersector1).intersect;
              auVar34._8_8_ = (This->intersector1).occluded;
              fVar87 = (float)auVar34._0_8_;
              uVar181 = (undefined4)((ulong)auVar34._0_8_ >> 0x20);
              uVar55 = (undefined4)auVar34._8_8_;
              uVar56 = (undefined4)((ulong)auVar34._8_8_ >> 0x20);
              local_1278._0_4_ = -(uint)(local_11d8 <= fVar87) & local_1278._0_4_;
              local_1278._4_4_ = -(uint)(fStack_11d4 <= fVar87) & local_1278._4_4_;
              local_1278._8_4_ = -(uint)(fStack_11d0 <= fVar87) & local_1278._8_4_;
              local_1278._12_4_ = -(uint)(fStack_11cc <= fVar87) & local_1278._12_4_;
              uVar51 = extractps(auVar34,1);
              ray = local_1248;
              pauVar69 = local_1240;
              fVar111 = (float)local_1288;
              fVar118 = local_1288._4_4_;
              fVar122 = fStack_1280;
              fVar125 = fStack_127c;
              fVar109 = local_11d8;
              fVar127 = fStack_11d4;
              fVar72 = fStack_11d0;
              fVar158 = fStack_11cc;
              fVar110 = (float)local_1268._0_4_;
              fVar117 = (float)local_1268._4_4_;
              fVar121 = fStack_1260;
              fVar124 = fStack_125c;
LAB_006999bd:
              uVar52 = (uint)uVar51;
              uVar53 = (undefined4)((ulong)pbVar57 >> 0x20);
              iVar48 = movmskps((int)pbVar57,local_1278);
              context = (RayQueryContext *)CONCAT44(uVar53,iVar48);
              if (iVar48 == 0) goto LAB_0069a0f8;
              auVar46._4_4_ = fVar127;
              auVar46._0_4_ = fVar109;
              auVar46._8_4_ = fVar72;
              auVar46._12_4_ = fVar158;
              auVar134 = blendvps(_DAT_01f45a30,auVar46,local_1278);
              auVar130._4_4_ = auVar134._0_4_;
              auVar130._0_4_ = auVar134._4_4_;
              auVar130._8_4_ = auVar134._12_4_;
              auVar130._12_4_ = auVar134._8_4_;
              auVar73 = minps(auVar130,auVar134);
              auVar97._0_8_ = auVar73._8_8_;
              auVar97._8_4_ = auVar73._0_4_;
              auVar97._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar97,auVar73);
              auVar98._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar134._4_4_) & local_1278._4_4_,
                            -(uint)(auVar73._0_4_ == auVar134._0_4_) & local_1278._0_4_);
              auVar98._8_4_ = -(uint)(auVar73._8_4_ == auVar134._8_4_) & local_1278._8_4_;
              auVar98._12_4_ = -(uint)(auVar73._12_4_ == auVar134._12_4_) & local_1278._12_4_;
              iVar48 = movmskps(iVar48,auVar98);
              auVar83 = local_1278;
              if (iVar48 != 0) {
                auVar83._8_4_ = auVar98._8_4_;
                auVar83._0_8_ = auVar98._0_8_;
                auVar83._12_4_ = auVar98._12_4_;
              }
              uVar54 = movmskps(iVar48,auVar83);
              uVar49 = CONCAT44(uVar53,uVar54);
              lVar65 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              goto LAB_0069995a;
            }
          }
LAB_00699602:
          local_12a8 = CONCAT44(fStack_12a0,fStack_12a0);
          fStack_129c = fStack_12a0;
          fVar123 = fVar110 - local_1188;
          fVar145 = fVar117 - fStack_1184;
          fStack_1290 = fVar121 - fStack_1180;
          fStack_128c = fVar124 - fStack_117c;
          fVar72 = fVar111 - local_1078;
          fVar86 = fVar118 - fStack_1074;
          fStack_1180 = fVar122 - fStack_1070;
          fStack_117c = fVar125 - fStack_106c;
          fVar156 = (float)local_1228 - local_1088;
          fVar104 = local_1228._4_4_ - fStack_1084;
          fVar105 = fStack_1220 - fStack_1080;
          fVar106 = fStack_121c - fStack_107c;
          fVar158 = (float)local_1258 - fVar110;
          fVar87 = local_1258._4_4_ - fVar117;
          fVar88 = fStack_1250 - fVar121;
          fVar89 = fStack_124c - fVar124;
          fVar154 = local_1068 - fVar111;
          fVar155 = fStack_1064 - fVar118;
          fVar163 = fStack_1060 - fVar122;
          fVar165 = fStack_105c - fVar125;
          fVar167 = local_1058 - (float)local_1228;
          fVar169 = fStack_1054 - local_1228._4_4_;
          fVar171 = fStack_1050 - fStack_1220;
          fVar172 = fStack_104c - fStack_121c;
          _local_1188 = CONCAT44(fVar86,fVar72);
          local_10b8[0] = fVar154 * fVar156 - fVar167 * fVar72;
          local_10b8[1] = fVar155 * fVar104 - fVar169 * fVar86;
          local_10b8[2] = fVar163 * fVar105 - fVar171 * fStack_1180;
          local_10b8[3] = fVar165 * fVar106 - fVar172 * fStack_117c;
          local_1298 = (byte *)CONCAT44(fVar145,fVar123);
          fVar152 = fVar167 * fVar123 - fVar158 * fVar156;
          fVar153 = fVar169 * fVar145 - fVar87 * fVar104;
          fStack_1250 = fVar171 * fStack_1290 - fVar88 * fVar105;
          fStack_124c = fVar172 * fStack_128c - fVar89 * fVar106;
          fVar126 = fVar158 * fVar72 - fVar154 * fVar123;
          fVar149 = fVar87 * fVar86 - fVar155 * fVar145;
          fVar150 = fVar88 * fStack_1180 - fVar163 * fStack_1290;
          fVar151 = fVar89 * fStack_117c - fVar165 * fStack_128c;
          local_1268._0_4_ = fVar110 - auVar103._0_4_;
          local_1268._4_4_ = fVar117 - auVar103._4_4_;
          fStack_1260 = fVar121 - auVar103._8_4_;
          fStack_125c = fVar124 - auVar103._12_4_;
          fVar111 = fVar111 - fStack_12a0;
          fVar118 = fVar118 - fStack_12a0;
          fStack_1280 = fVar122 - fStack_12a0;
          fStack_127c = fVar125 - fStack_12a0;
          local_1288 = (byte *)CONCAT44(fVar118,fVar111);
          local_1228._0_4_ = (float)local_1228 - fVar109;
          local_1228._4_4_ = local_1228._4_4_ - fVar109;
          fStack_1220 = fStack_1220 - fVar109;
          fStack_121c = fStack_121c - fVar109;
          fVar109 = fVar111 * fStack_1234 - (float)local_1228 * local_11e8._4_4_;
          fVar124 = fVar118 * fStack_1234 - local_1228._4_4_ * local_11e8._4_4_;
          fVar90 = fStack_1280 * fStack_1234 - fStack_1220 * local_11e8._4_4_;
          fVar91 = fStack_127c * fStack_1234 - fStack_121c * local_11e8._4_4_;
          fVar121 = (float)local_1228 * fVar127 - (float)local_1268._0_4_ * fStack_1234;
          fVar157 = local_1228._4_4_ * fVar127 - (float)local_1268._4_4_ * fStack_1234;
          fVar107 = fStack_1220 * fVar127 - fStack_1260 * fStack_1234;
          fVar108 = fStack_121c * fVar127 - fStack_125c * fStack_1234;
          local_1098._4_4_ = fVar149;
          local_1098._0_4_ = fVar126;
          fStack_1090 = fVar150;
          fStack_108c = fVar151;
          fVar112 = (float)local_1268._0_4_ * local_11e8._4_4_ - fVar111 * fVar127;
          fVar113 = (float)local_1268._4_4_ * local_11e8._4_4_ - fVar118 * fVar127;
          fVar119 = fStack_1260 * local_11e8._4_4_ - fStack_1280 * fVar127;
          fVar120 = fStack_125c * local_11e8._4_4_ - fStack_127c * fVar127;
          local_1258 = (byte *)CONCAT44(fVar153,fVar152);
          fVar92 = fVar127 * local_10b8[0] + local_11e8._4_4_ * fVar152 + fStack_1234 * fVar126;
          fVar93 = fVar127 * local_10b8[1] + local_11e8._4_4_ * fVar153 + fStack_1234 * fVar149;
          fVar94 = fVar127 * local_10b8[2] + local_11e8._4_4_ * fStack_1250 + fStack_1234 * fVar150;
          fVar127 = fVar127 * local_10b8[3] + local_11e8._4_4_ * fStack_124c + fStack_1234 * fVar151
          ;
          uVar159 = (uint)fVar92 & 0x80000000;
          uVar160 = (uint)fVar93 & 0x80000000;
          uVar161 = (uint)fVar94 & 0x80000000;
          uVar162 = (uint)fVar127 & 0x80000000;
          fVar122 = (float)((uint)(fVar158 * fVar109 + fVar154 * fVar121 + fVar167 * fVar112) ^
                           uVar159);
          fVar125 = (float)((uint)(fVar87 * fVar124 + fVar155 * fVar157 + fVar169 * fVar113) ^
                           uVar160);
          fVar110 = (float)((uint)(fVar88 * fVar90 + fVar163 * fVar107 + fVar171 * fVar119) ^
                           uVar161);
          fVar117 = (float)((uint)(fVar89 * fVar91 + fVar165 * fVar108 + fVar172 * fVar120) ^
                           uVar162);
          fVar121 = (float)((uint)(fVar109 * fVar123 + fVar121 * fVar72 + fVar112 * fVar156) ^
                           uVar159);
          fVar124 = (float)((uint)(fVar124 * fVar145 + fVar157 * fVar86 + fVar113 * fVar104) ^
                           uVar160);
          fVar72 = (float)((uint)(fVar90 * fStack_1290 + fVar107 * fStack_1180 + fVar119 * fVar105)
                          ^ uVar161);
          fVar113 = (float)((uint)(fVar91 * fStack_128c + fVar108 * fStack_117c + fVar120 * fVar106)
                           ^ uVar162);
          fVar119 = ABS(fVar92);
          fVar120 = ABS(fVar93);
          local_1118._0_8_ = CONCAT44(fVar93,fVar92) & 0x7fffffff7fffffff;
          local_1118._8_4_ = ABS(fVar94);
          local_1118._12_4_ = ABS(fVar127);
          auVar144._0_4_ =
               -(uint)((0.0 <= fVar122 && 0.0 <= fVar121) && fVar92 != 0.0) & local_fa8 &
               -(uint)(fVar122 + fVar121 <= fVar119);
          auVar144._4_4_ =
               -(uint)((0.0 <= fVar125 && 0.0 <= fVar124) && fVar93 != 0.0) & uStack_fa4 &
               -(uint)(fVar125 + fVar124 <= fVar120);
          auVar144._8_4_ =
               -(uint)((0.0 <= fVar110 && 0.0 <= fVar72) && fVar94 != 0.0) & uStack_fa0 &
               -(uint)(fVar110 + fVar72 <= local_1118._8_4_);
          auVar144._12_4_ =
               -(uint)((0.0 <= fVar117 && 0.0 <= fVar113) && fVar127 != 0.0) & uStack_f9c &
               -(uint)(fVar117 + fVar113 <= local_1118._12_4_);
          iVar48 = movmskps(uVar52,auVar144);
          fVar158 = local_fb8;
          fVar86 = fStack_fb4;
          fVar87 = fStack_fb0;
          fVar88 = fStack_fac;
          fVar109 = local_fc8;
          fVar89 = fStack_fc4;
          fVar90 = fStack_fc0;
          fVar91 = fStack_fbc;
          fVar127 = local_fd8;
          fVar92 = fStack_fd4;
          fVar93 = fStack_fd0;
          fVar94 = fStack_fcc;
          fVar156 = local_fe8;
          fVar104 = fStack_fe4;
          fVar105 = fStack_fe0;
          fVar106 = fStack_fdc;
          fVar157 = local_ff8;
          fVar107 = fStack_ff4;
          fVar108 = fStack_ff0;
          fVar112 = fStack_fec;
          if (iVar48 != 0) {
            local_1128 = (float)(uVar159 ^
                                (uint)((float)local_1268._0_4_ * local_10b8[0] +
                                      fVar111 * fVar152 + (float)local_1228 * fVar126));
            fStack_1124 = (float)(uVar160 ^
                                 (uint)((float)local_1268._4_4_ * local_10b8[1] +
                                       fVar118 * fVar153 + local_1228._4_4_ * fVar149));
            fStack_1120 = (float)(uVar161 ^
                                 (uint)(fStack_1260 * local_10b8[2] +
                                       fStack_1280 * fStack_1250 + fStack_1220 * fVar150));
            fStack_111c = (float)(uVar162 ^
                                 (uint)(fStack_125c * local_10b8[3] +
                                       fStack_127c * fStack_124c + fStack_121c * fVar151));
            fVar111 = *(float *)((long)&This->leafIntersector + 4);
            bVar40 = fVar111 * fVar119 < local_1128;
            bVar41 = fVar111 * fVar120 < fStack_1124;
            bVar42 = fVar111 * local_1118._8_4_ < fStack_1120;
            bVar43 = fVar111 * local_1118._12_4_ < fStack_111c;
            auVar131._4_4_ = -(uint)bVar41;
            auVar131._0_4_ = -(uint)bVar40;
            auVar131._8_4_ = -(uint)bVar42;
            auVar131._12_4_ = -(uint)bVar43;
            auVar35._0_8_ = (This->intersector1).intersect;
            auVar35._8_8_ = (This->intersector1).occluded;
            fVar111 = (float)auVar35._0_8_;
            uVar181 = (undefined4)((ulong)auVar35._0_8_ >> 0x20);
            fStack_1290 = (float)auVar35._8_8_;
            fStack_128c = (float)((ulong)auVar35._8_8_ >> 0x20);
            auVar84._0_4_ = -(uint)(local_1128 <= fVar111 * fVar119 && bVar40) & auVar144._0_4_;
            auVar84._4_4_ = -(uint)(fStack_1124 <= fVar111 * fVar120 && bVar41) & auVar144._4_4_;
            auVar84._8_4_ =
                 -(uint)(fStack_1120 <= fVar111 * local_1118._8_4_ && bVar42) & auVar144._8_4_;
            auVar84._12_4_ =
                 -(uint)(fStack_111c <= fVar111 * local_1118._12_4_ && bVar43) & auVar144._12_4_;
            iVar48 = movmskps(iVar48,auVar84);
            if (iVar48 != 0) {
              local_10f8 = auVar84;
              local_10a8 = local_1258;
              uStack_10a0 = CONCAT44(fStack_124c,fStack_1250);
              local_1148._4_4_ = fVar120 - fVar125;
              local_1148._0_4_ = fVar119 - fVar122;
              fStack_1140 = local_1118._8_4_ - fVar110;
              fStack_113c = local_1118._12_4_ - fVar117;
              local_1138._0_4_ = fVar119 - fVar121;
              local_1138._4_4_ = fVar120 - fVar124;
              fStack_1130 = local_1118._8_4_ - fVar72;
              fStack_112c = local_1118._12_4_ - fVar113;
              local_1278 = auVar84;
              auVar73 = rcpps(auVar131,local_1118);
              fVar118 = auVar73._0_4_;
              fVar121 = auVar73._4_4_;
              fVar124 = auVar73._8_4_;
              fVar72 = auVar73._12_4_;
              fVar118 = (1.0 - fVar119 * fVar118) * fVar118 + fVar118;
              fVar121 = (1.0 - fVar120 * fVar121) * fVar121 + fVar121;
              fVar124 = (1.0 - local_1118._8_4_ * fVar124) * fVar124 + fVar124;
              fVar72 = (1.0 - local_1118._12_4_ * fVar72) * fVar72 + fVar72;
              local_10c8 = (undefined1  [8])CONCAT44(fStack_1124 * fVar121,local_1128 * fVar118);
              fStack_10c0 = fStack_1120 * fVar124;
              fStack_10bc = fStack_111c * fVar72;
              local_10e8[0] = (fVar119 - fVar122) * fVar118;
              local_10e8[1] = (fVar120 - fVar125) * fVar121;
              local_10e8[2] = (local_1118._8_4_ - fVar110) * fVar124;
              local_10e8[3] = (local_1118._12_4_ - fVar117) * fVar72;
              local_10d8._0_4_ = fVar118 * (float)local_1138._0_4_;
              local_10d8._4_4_ = fVar121 * (float)local_1138._4_4_;
              fStack_10d0 = fVar124 * fStack_1130;
              fStack_10cc = fVar72 * fStack_112c;
              auVar134 = blendvps(_DAT_01f45a30,_local_10c8,auVar84);
              auVar132._4_4_ = auVar134._0_4_;
              auVar132._0_4_ = auVar134._4_4_;
              auVar132._8_4_ = auVar134._12_4_;
              auVar132._12_4_ = auVar134._8_4_;
              auVar73 = minps(auVar132,auVar134);
              auVar99._0_8_ = auVar73._8_8_;
              auVar99._8_4_ = auVar73._0_4_;
              auVar99._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar99,auVar73);
              auVar100._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar134._4_4_) & auVar84._4_4_,
                            -(uint)(auVar73._0_4_ == auVar134._0_4_) & auVar84._0_4_);
              auVar100._8_4_ = -(uint)(auVar73._8_4_ == auVar134._8_4_) & auVar84._8_4_;
              auVar100._12_4_ = -(uint)(auVar73._12_4_ == auVar134._12_4_) & auVar84._12_4_;
              iVar48 = movmskps(iVar48,auVar100);
              auVar139._8_4_ = fStack_10c0;
              auVar139._0_8_ = local_10c8;
              auVar139._12_4_ = fStack_10bc;
              if (iVar48 != 0) {
                auVar84._8_4_ = auVar100._8_4_;
                auVar84._0_8_ = auVar100._0_8_;
                auVar84._12_4_ = auVar100._12_4_;
              }
              uVar51 = extractps(auVar35,1);
              uVar55 = movmskps((int)context,auVar84);
              uVar49 = CONCAT44((int)((ulong)context >> 0x20),uVar55);
              local_1228 = 0;
              local_12a8 = lVar65;
              fStack_1230 = fStack_1234;
              fStack_122c = fStack_1234;
              fStack_11e0 = local_11e8._4_4_;
              fStack_11dc = local_11e8._4_4_;
              local_11e8._0_4_ = local_11e8._4_4_;
              local_1238 = fStack_1234;
              if (uVar49 != 0) {
                for (; (uVar49 >> local_1228 & 1) == 0; local_1228 = local_1228 + 1) {
                }
              }
LAB_00699d88:
              local_11b0 = *(uint *)(local_12a8 + 0x40 + local_1228 * 4);
              pbVar57 = (byte *)(ulong)local_11b0;
              local_1258 = *(byte **)(*(long *)(local_1170 + 0x1e8) + (long)pbVar57 * 8);
              if ((*(uint *)(local_1258 + 0x34) & (uint)uVar51) == 0) {
                *(undefined4 *)(local_1278 + local_1228 * 4) = 0;
              }
              else {
                local_1288 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
                if (*(long *)(local_1288 + 0x10) == 0) {
                  local_1208 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(local_1258 + 0x40) == 0) {
                    fVar111 = local_10e8[local_1228];
                    uVar181 = *(undefined4 *)(local_10d8 + local_1228 * 4);
                    *(float *)&(This->intersector1).intersect = local_10b8[local_1228 + -4];
                    *(float *)&(This->intersector1).pointQuery = local_10b8[local_1228];
                    *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                         *(undefined4 *)((long)&local_10a8 + local_1228 * 4);
                    *(undefined4 *)&(This->intersector1).name =
                         *(undefined4 *)(local_1098 + local_1228 * 4);
                    *(float *)((long)&(This->intersector1).name + 4) = fVar111;
                    *(undefined4 *)&(This->intersector4).intersect = uVar181;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)(local_12a8 + 0x50 + local_1228 * 4);
                    *(uint *)&(This->intersector4).occluded = local_11b0;
                    context = (RayQueryContext *)(ulong)*local_1208;
                    *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1208;
                    *(uint *)&(This->intersector4).name = local_1208[1];
                    goto LAB_006997d7;
                  }
                  _local_1268 = auVar139;
                }
                else {
                  _local_1268 = auVar139;
                  local_1208 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                }
                local_1298 = (byte *)CONCAT44(uVar181,fVar111);
                local_11c8 = local_10b8[local_1228];
                local_11c4 = *(undefined4 *)((long)&local_10a8 + local_1228 * 4);
                local_11c0 = *(undefined4 *)(local_1098 + local_1228 * 4);
                local_11bc = local_10e8[local_1228];
                local_11b8 = *(undefined4 *)(local_10d8 + local_1228 * 4);
                local_11b4 = *(undefined4 *)(local_12a8 + 0x50 + local_1228 * 4);
                local_11ac = *local_1208;
                local_11a8 = local_1208[1];
                *(float *)&(This->intersector1).intersect = local_10b8[local_1228 + -4];
                local_12ac = -1;
                local_1218 = &local_12ac;
                pbVar57 = *(byte **)(local_1258 + 0x18);
                local_1210 = pbVar57;
                local_1200 = This;
                local_11f8 = &local_11c8;
                local_11f0 = 1;
                _local_1268 = auVar139;
                if (((*(code **)(local_1258 + 0x40) == (code *)0x0) ||
                    ((**(code **)(local_1258 + 0x40))(&local_1218), *local_1218 != 0)) &&
                   (((*(code **)(local_1288 + 0x10) == (code *)0x0 ||
                     ((pbVar57 = local_1288, (*local_1288 & 2) == 0 &&
                      (pbVar57 = local_1258, (local_1258[0x3e] & 0x40) == 0)))) ||
                    ((**(code **)(local_1288 + 0x10))(&local_1218), *local_1218 != 0)))) {
                  *(float *)&(local_1200->intersector1).pointQuery = *local_11f8;
                  *(float *)((long)&(local_1200->intersector1).pointQuery + 4) = local_11f8[1];
                  *(float *)&(local_1200->intersector1).name = local_11f8[2];
                  *(float *)((long)&(local_1200->intersector1).name + 4) = local_11f8[3];
                  *(float *)&(local_1200->intersector4).intersect = local_11f8[4];
                  *(float *)((long)&(local_1200->intersector4).intersect + 4) = local_11f8[5];
                  *(float *)&(local_1200->intersector4).occluded = local_11f8[6];
                  *(float *)((long)&(local_1200->intersector4).occluded + 4) = local_11f8[7];
                  pbVar57 = (byte *)(ulong)(uint)local_11f8[8];
                  *(float *)&(local_1200->intersector4).name = local_11f8[8];
                }
                else {
                  *(undefined4 *)&(This->intersector1).intersect = (undefined4)local_1298;
                }
                *(undefined4 *)(local_1278 + local_1228 * 4) = 0;
                auVar36._0_8_ = (This->intersector1).intersect;
                auVar36._8_8_ = (This->intersector1).occluded;
                fVar111 = (float)auVar36._0_8_;
                uVar181 = (undefined4)((ulong)auVar36._0_8_ >> 0x20);
                fStack_1290 = (float)auVar36._8_8_;
                fStack_128c = (float)((ulong)auVar36._8_8_ >> 0x20);
                local_1278._0_4_ = -(uint)(local_1268._0_4_ <= fVar111) & local_1278._0_4_;
                local_1278._4_4_ = -(uint)(local_1268._4_4_ <= fVar111) & local_1278._4_4_;
                local_1278._8_4_ = -(uint)(local_1268._8_4_ <= fVar111) & local_1278._8_4_;
                local_1278._12_4_ = -(uint)(local_1268._12_4_ <= fVar111) & local_1278._12_4_;
                uVar51 = extractps(auVar36,1);
                ray = local_1248;
                pauVar69 = local_1240;
                auVar139 = _local_1268;
                fVar158 = local_fb8;
                fVar86 = fStack_fb4;
                fVar87 = fStack_fb0;
                fVar88 = fStack_fac;
                fVar109 = local_fc8;
                fVar89 = fStack_fc4;
                fVar90 = fStack_fc0;
                fVar91 = fStack_fbc;
                fVar127 = local_fd8;
                fVar92 = fStack_fd4;
                fVar93 = fStack_fd0;
                fVar94 = fStack_fcc;
                fVar156 = local_fe8;
                fVar104 = fStack_fe4;
                fVar105 = fStack_fe0;
                fVar106 = fStack_fdc;
                fVar157 = local_ff8;
                fVar107 = fStack_ff4;
                fVar108 = fStack_ff0;
                fVar112 = fStack_fec;
              }
              uVar55 = (undefined4)((ulong)pbVar57 >> 0x20);
              iVar48 = movmskps((int)pbVar57,local_1278);
              context = (RayQueryContext *)CONCAT44(uVar55,iVar48);
              if (iVar48 == 0) goto LAB_006997d7;
              auVar134 = blendvps(_DAT_01f45a30,auVar139,local_1278);
              auVar133._4_4_ = auVar134._0_4_;
              auVar133._0_4_ = auVar134._4_4_;
              auVar133._8_4_ = auVar134._12_4_;
              auVar133._12_4_ = auVar134._8_4_;
              auVar73 = minps(auVar133,auVar134);
              auVar101._0_8_ = auVar73._8_8_;
              auVar101._8_4_ = auVar73._0_4_;
              auVar101._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar101,auVar73);
              auVar102._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar134._4_4_) & local_1278._4_4_,
                            -(uint)(auVar73._0_4_ == auVar134._0_4_) & local_1278._0_4_);
              auVar102._8_4_ = -(uint)(auVar73._8_4_ == auVar134._8_4_) & local_1278._8_4_;
              auVar102._12_4_ = -(uint)(auVar73._12_4_ == auVar134._12_4_) & local_1278._12_4_;
              iVar48 = movmskps(iVar48,auVar102);
              auVar85 = local_1278;
              if (iVar48 != 0) {
                auVar85._8_4_ = auVar102._8_4_;
                auVar85._0_8_ = auVar102._0_8_;
                auVar85._12_4_ = auVar102._12_4_;
              }
              uVar56 = movmskps(iVar48,auVar85);
              uVar49 = CONCAT44(uVar55,uVar56);
              local_1228 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> local_1228 & 1) == 0; local_1228 = local_1228 + 1) {
                }
              }
              goto LAB_00699d88;
            }
          }
LAB_006997d7:
          fVar111 = local_f88;
          fVar125 = fStack_f84;
          fVar110 = fStack_f80;
          fVar117 = fStack_f7c;
          fVar122 = local_f98;
          fVar121 = fStack_f94;
          fVar124 = fStack_f90;
          fVar72 = fStack_f8c;
        }
        fVar118 = *(float *)&(This->intersector1).intersect;
        auVar134._4_4_ = fVar118;
        auVar134._0_4_ = fVar118;
        auVar134._8_4_ = fVar118;
        auVar134._12_4_ = fVar118;
      }
      goto LAB_00698b50;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }